

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_common.cpp
# Opt level: O2

int __thiscall pstore::brokerface::writer::writer(writer *this,UI *ui,UI_STRING *uis)

{
  value_type vVar1;
  int extraout_EAX;
  uint in_ECX;
  function<void_()> *in_R8;
  
  this->_vptr_writer = (_func_int **)&PTR__writer_0025e370;
  vVar1 = *(value_type *)ui;
  *(undefined4 *)ui = 0xffffffff;
  (this->fd_).fd_ = vVar1;
  (this->retry_timeout_).__r = (rep)uis;
  this->max_retries_ = in_ECX;
  std::function<void_()>::function(&this->update_cb_,in_R8);
  return extraout_EAX;
}

Assistant:

writer::writer (fifo_path::client_pipe && pipe, duration_type const retry_timeout,
                        unsigned const max_retries, update_callback cb)
                : fd_{std::move (pipe)}
                , retry_timeout_{retry_timeout}
                , max_retries_{max_retries}
                , update_cb_{std::move (cb)} {}